

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::RemoveUnscriptableCommands(cmState *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  iterator __position;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unscriptableCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_node = (this->Commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Commands)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      cVar2 = (**(code **)(**(long **)(__position._M_node + 2) + 0x48))();
      if (cVar2 == '\0') {
        if (*(long **)(__position._M_node + 2) != (long *)0x0) {
          (**(code **)(**(long **)(__position._M_node + 2) + 8))();
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                            *)&this->Commands,__position);
      }
      else {
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      __position._M_node = p_Var3;
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  for(int i=0; cmCacheEntryTypes[i]; ++i)
    {
    if(strcmp(key.c_str(), cmCacheEntryTypes[i]) == 0)
      {
      return true;
      }
    }
  return false;
}